

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

void __thiscall sjtu::TrainManager::query_train(TrainManager *this,int argc,string *argv)

{
  bool bVar1;
  undefined8 uVar2;
  string *str;
  timeType *date_00;
  void *this_00;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  pair<long,_bool> pVar3;
  pair<long,_bool> ret;
  int i;
  string date;
  string trainID;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  trainType *this_01;
  StringHasher *in_stack_ffffffffffffff00;
  string local_e8 [48];
  unsigned_long_long *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  string local_a8 [32];
  hashType local_88;
  timeType *local_80;
  byte local_78;
  int local_5c;
  string local_58 [32];
  string local_38 [32];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  local_5c = 0;
  do {
    if (local_c <= local_5c) {
      this_01 = *(trainType **)(in_RDI + 8);
      str = (string *)(in_RDI + 0x10);
      std::__cxx11::string::string(local_a8,local_38);
      local_88 = StringHasher::operator()(in_stack_ffffffffffffff00,str);
      pVar3 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                        ((BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *
                         )CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff48);
      date_00 = (timeType *)pVar3.first;
      local_78 = pVar3.second;
      local_80 = date_00;
      std::__cxx11::string::~string(local_a8);
      if ((local_78 & 1) == 0) {
        this_00 = (void *)std::ostream::operator<<(&std::cout,-1);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      else {
        (**(code **)(**(long **)(in_RDI + 0x20) + 0x10))(*(long **)(in_RDI + 0x20),&local_80);
        std::__cxx11::string::string(local_e8,local_58);
        timeType::timeType((timeType *)this_01,(string *)date_00);
        trainType::display(this_01,date_00);
        std::__cxx11::string::~string(local_e8);
      }
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
      return;
    }
    bVar1 = std::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (bVar1) {
      std::__cxx11::string::operator=(local_38,(string *)((long)local_5c * 0x20 + 0x20 + local_18));
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (!bVar1) {
        uVar2 = __cxa_allocate_exception(0x68);
        invalid_command::invalid_command
                  ((invalid_command *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0))
        ;
        __cxa_throw(uVar2,&invalid_command::typeinfo,invalid_command::~invalid_command);
      }
      std::__cxx11::string::operator=(local_58,(string *)((long)local_5c * 0x20 + 0x20 + local_18));
    }
    local_5c = local_5c + 2;
  } while( true );
}

Assistant:

void query_train(int argc , std::string *argv)
		{
			std::string trainID , date;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else TrainFile -> read(ret.first) -> display(timeType(date));
		}